

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_char,_signed_char>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_char,_signed_char> *this)

{
  char cVar1;
  uchar uVar2;
  uchar *puVar3;
  int iVar4;
  bool bVar5;
  unsigned_long uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  byte bVar12;
  
  bVar11 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) && (this->maximum != this->minimum)) ||
       (1 < (byte)(this->mode - AUTO))) {
      puVar3 = &this->min_max_diff;
      bVar5 = TrySubtractOperator::Operation<unsigned_char,unsigned_char,unsigned_char>
                        (this->maximum,this->minimum,puVar3);
      this->can_do_for = bVar5;
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        cVar1 = this->minimum_delta;
        if ((this->maximum_delta == cVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 6;
          return true;
        }
        bVar12 = this->min_max_delta_diff;
        if (bVar12 == 0) {
          bVar12 = 0;
        }
        else {
          iVar4 = 0x1f;
          if (bVar12 != 0) {
            for (; bVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          bVar8 = 8 - ((byte)iVar4 ^ 7);
          bVar12 = 8;
          if (bVar8 < 8) {
            bVar12 = bVar8;
          }
        }
        bVar8 = *puVar3;
        if (bVar8 == 0) {
          bVar8 = 0;
        }
        else {
          iVar4 = 0x1f;
          if (bVar8 != 0) {
            for (; bVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          bVar9 = 8 - ((byte)iVar4 ^ 7);
          bVar8 = 8;
          if (bVar9 < 8) {
            bVar8 = bVar9;
          }
        }
        bVar5 = this->mode != FOR;
        if (bVar5 && bVar12 < bVar8) {
          if (this->compression_buffer_idx != 0) {
            uVar7 = 0;
            do {
              this->delta_buffer[uVar7] = this->delta_buffer[uVar7] - cVar1;
              uVar7 = uVar7 + 1;
            } while (uVar7 < this->compression_buffer_idx);
          }
          this->total_size = this->total_size + 10;
          uVar7 = this->compression_buffer_idx;
          if ((uVar7 & 0x1f) != 0) {
            uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar7 & 0x1f);
            uVar7 = (uVar7 - uVar6) + 0x20;
          }
          this->total_size = this->total_size + (bVar12 * uVar7 >> 3);
          if (bVar5 && bVar12 < bVar8) {
            return true;
          }
        }
      }
      if (this->can_do_for == true) {
        bVar12 = *puVar3;
        if (bVar12 == 0) {
          uVar7 = 0;
        }
        else {
          iVar4 = 0x1f;
          if (bVar12 != 0) {
            for (; bVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          bVar8 = 8 - ((byte)iVar4 ^ 7);
          bVar12 = 8;
          if (bVar8 < 8) {
            bVar12 = bVar8;
          }
          uVar7 = (ulong)bVar12;
        }
        if (this->compression_buffer_idx != 0) {
          puVar3 = this->compression_buffer;
          uVar2 = this->minimum;
          uVar10 = 0;
          do {
            puVar3[uVar10] = puVar3[uVar10] - uVar2;
            uVar10 = uVar10 + 1;
          } while (uVar10 < this->compression_buffer_idx);
        }
        uVar10 = this->compression_buffer_idx;
        if ((uVar10 & 0x1f) != 0) {
          uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar10 & 0x1f);
          uVar10 = (uVar10 - uVar6) + 0x20;
        }
        this->total_size = this->total_size + (uVar10 * uVar7 >> 3) + 9;
      }
      else {
        bVar11 = false;
      }
    }
    else {
      this->total_size = this->total_size + 5;
    }
  }
  return bVar11;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}